

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RECALL(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  char *pcVar4;
  bool inward_00;
  int local_34;
  wchar_t place;
  _Bool inward;
  wchar_t current;
  wchar_t point;
  wchar_t num_poss;
  wchar_t num_recall_points;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  point = L'\0';
  pcVar4 = strstr(world->name,"Dungeon");
  wVar2 = L'\x04';
  if (pcVar4 != (char *)0x0) {
    wVar2 = L'\x01';
  }
  local_34 = (int)player->place;
  inward_00 = local_34 != player->home;
  context->ident = true;
  if ((((((player->opts).opt[0x20] & 1U) == 0) || (player->total_winner != 0)) &&
      ((local_34 != 0 || (cave->mon_cnt != 1)))) &&
     (((player->place != player->home || (player->recall_pt != 0)) && (player->home != 0)))) {
    if ((player->upkeep->arena_level & 1U) == 0) {
      for (num_poss = L'\0'; num_poss < wVar2; num_poss = num_poss + L'\x01') {
        if (player->recall[num_poss] != 0) {
          point = point + L'\x01';
        }
      }
      if (player->word_recall == 0) {
        wVar2 = get_recall_point(inward_00,point,wVar2);
        if (wVar2 < L'\0') {
          return false;
        }
        if (inward_00) {
          if ((world->levels[local_34].locality == LOC_UNDERWORLD) ||
             (world->levels[local_34].locality == LOC_MOUNTAIN_TOP)) {
            local_34 = (int)player->last_place;
          }
          if ((wVar2 < point + L'\x01') && (local_34 != 0)) {
            player->recall[wVar2] = (int16_t)local_34;
          }
          player->recall_pt = (int16_t)local_34;
        }
        else {
          if (player->recall[wVar2] == 0) {
            return false;
          }
          player->recall_pt = player->recall[wVar2];
        }
        uVar3 = Rand_div(0x14);
        player->word_recall = (short)uVar3 + 0xf;
        msg("The air about you becomes charged...");
      }
      else {
        _Var1 = get_check("Word of Recall is already active.  Do you want to cancel it? ");
        if (!_Var1) {
          return false;
        }
        player->word_recall = 0;
        msg("A tension leaves the air around you...");
      }
      player->upkeep->redraw = player->upkeep->redraw | 0x2000;
      handle_stuff(player);
    }
    else {
      msg("Nothing happens.");
    }
  }
  else {
    msg("Nothing happens.");
  }
  return true;
}

Assistant:

bool effect_handler_RECALL(effect_handler_context_t *context)
{
	//int target_place;
	int i, num_recall_points = 0;
	int num_poss = strstr(world->name, "Dungeon") ? 1 : 4;
	int point, current = player->place;
	bool inward = (current != player->home);
	context->ident = true;	

	/* No recall */
	if ((OPT(player, birth_no_recall) && !player->total_winner) ||
		((!current) && (cave->mon_cnt == 1)) ||
		((player->place == player->home) && !player->recall_pt) ||
		!player->home) {
		msg("Nothing happens.");
		return true;
	}

	/* No recall from quest levels with force_descend */
	//if (OPT(player, birth_force_descend) && (quest_forbid_downstairs(player->depth))) {
	//	msg("Nothing happens.");
	//	return true;
	//}

	/* No recall from single combat */
	if (player->upkeep->arena_level) {
		msg("Nothing happens.");
		return true;
	}

	/* Warn the player if they're descending to an unrecallable level */
	//target_place = player_get_next_place(player->max_depth, "down", 1);
	//if (OPT(player, birth_force_descend) && !(player->depth) &&
	//		(quest_forbid_downstairs(target_place))) {
	//	if (!get_check("Are you sure you want to descend? ")) {
	//		return false;
	//	}
	//}

	/* Find how many recall points currently exist */
	for (i = 0; i < num_poss; i++) {
		if (player->recall[i]) {
			num_recall_points++;
		}
	}

	/* Activate recall */
	if (!player->word_recall) {
		point = get_recall_point(inward, num_recall_points, num_poss);
		if (point >= 0) {
			if (inward) {
				int place = 0;

				/* Set the point, being careful about underworld etc */
				if ((world->levels[current].locality == LOC_UNDERWORLD) ||
					(world->levels[current].locality == LOC_MOUNTAIN_TOP)) {
					place = player->last_place;
				} else {
					place = current;
 				}

				/* Check for replacement */
				if ((point < num_recall_points + 1) && (place)) {
					player->recall[point] = place;
				}

				/* Set it */
				player->recall_pt = place;
 			} else {
				if (!player->recall[point]) {
					return false;
				}
				player->recall_pt = player->recall[point];
 			}
 		} else {
			return false;
 		}

		player->word_recall = randint0(20) + 15;
		msg("The air about you becomes charged...");
	} else {
		/* Deactivate recall */
		if (!get_check("Word of Recall is already active.  Do you want to cancel it? "))
			return false;

		player->word_recall = 0;
		msg("A tension leaves the air around you...");
	}

	/* Redraw status line */
	player->upkeep->redraw |= PR_STATUS;
	handle_stuff(player);

	return true;
}